

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_align.c
# Opt level: O3

void align_sen_active(uint8 *senlist,int32 n_sen)

{
  snode_t *psVar1;
  snode_t **ppsVar2;
  
  if (0 < n_sen) {
    memset(senlist,0,(ulong)(uint)n_sen);
  }
  psVar1 = *cur_active;
  ppsVar2 = cur_active;
  while( true ) {
    if (psVar1 == (snode_t *)0x0) {
      return;
    }
    ppsVar2 = ppsVar2 + 1;
    if ((long)psVar1->sen < 0) break;
    senlist[psVar1->sen] = '\x01';
    psVar1 = *ppsVar2;
  }
  __assert_fail("IS_S3SENID(cur_active[i]->sen)",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/s3_align.c"
                ,0x3f6,"void align_sen_active(uint8 *, int32)");
}

Assistant:

void
align_sen_active(uint8 * senlist, int32 n_sen)
{
    int32 i, sen;

    for (sen = 0; sen < n_sen; sen++)
        senlist[sen] = 0;

    for (i = 0; cur_active[i]; i++) {
        assert(IS_S3SENID(cur_active[i]->sen));
        senlist[cur_active[i]->sen] = 1;
    }
}